

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

int __thiscall TSMuxer::close(TSMuxer *this,int __fd)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int extraout_var;
  undefined8 unaff_RBP;
  undefined4 in_register_00000034;
  
  iVar3 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (this->m_isExternalFile == false) {
    if (((this->super_AbstractMuxer).m_sectorSize != 0) &&
       ((this->m_outBufLen != 0 ||
        (iVar2 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[4])
                           (this->m_muxFile,CONCAT44(in_register_00000034,__fd)),
        auVar1._4_4_ = extraout_var, auVar1._0_4_ = iVar2, auVar1._8_8_ = (long)extraout_var >> 0x1f
        , SUB168(auVar1 % SEXT816((long)(this->super_AbstractMuxer).m_sectorSize),0) != 0)))) {
      __assert_fail("m_outBufLen == 0 && m_muxFile->size() % m_sectorSize == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                    ,0x1d7,"virtual bool TSMuxer::close()");
    }
    iVar2 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[3])();
    if ((char)iVar2 != '\0') {
      if ((this->super_AbstractMuxer).m_sectorSize != 0) {
        return iVar3;
      }
      if (this->m_outBufLen < 1) {
LAB_001da634:
        iVar3 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[3])();
        return iVar3;
      }
      iVar3 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[2])
                        (this->m_muxFile,(this->m_outFileName)._M_dataplus._M_p,6,0);
      if ((char)iVar3 == '\0') {
        return 0;
      }
      iVar3 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[5])
                        (this->m_muxFile,this->m_outBuf,(ulong)(uint)this->m_outBufLen);
      if (iVar3 != 0) goto LAB_001da634;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

bool TSMuxer::close()
{
    if (m_isExternalFile)
        return true;

    if (m_sectorSize)
    {
        assert(m_outBufLen == 0 && m_muxFile->size() % m_sectorSize == 0);
    }

    if (!m_muxFile->close())
        return false;

    if (m_sectorSize)
        return true;

    if (m_outBufLen > 0)
    {
        if (!m_muxFile->open(m_outFileName.c_str(), AbstractOutputStream::ofWrite + AbstractOutputStream::ofAppend))
            return false;
        if (!writeOutFile(m_outBuf, m_outBufLen))
            return false;
    }
    const bool bRes = m_muxFile->close();
    return bRes;
}